

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

string * __thiscall hanabi_learning_env::HanabiState::ToString_abi_cxx11_(HanabiState *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  HanabiGame *this_00;
  ulong uVar4;
  size_type sVar5;
  HanabiDeck *this_01;
  HanabiState *in_RSI;
  string *in_RDI;
  int i_2;
  int i_1;
  int i;
  string *result;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  string *psVar6;
  string local_200 [24];
  HanabiCard *in_stack_fffffffffffffe18;
  string local_1e0 [36];
  int local_1bc;
  string local_1b8 [32];
  string local_198 [16];
  HanabiHand *in_stack_fffffffffffffe78;
  string local_178 [32];
  string local_158 [36];
  int local_134;
  string local_130 [32];
  string local_110 [36];
  int local_ec;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [48];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  psVar6 = in_RDI;
  std::__cxx11::string::string(in_RDI);
  LifeTokens(in_RSI);
  std::__cxx11::to_string((int)((ulong)psVar6 >> 0x20));
  std::operator+((char *)in_stack_fffffffffffffda8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  std::operator+(in_stack_fffffffffffffda8,
                 (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  std::__cxx11::string::operator+=(in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  InformationTokens(in_RSI);
  std::__cxx11::to_string((int)((ulong)psVar6 >> 0x20));
  std::operator+((char *)in_stack_fffffffffffffda8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  std::operator+(in_stack_fffffffffffffda8,
                 (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  std::__cxx11::string::operator+=(in_RDI,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::operator+=(in_RDI,"Fireworks: ");
  local_ec = 0;
  while( true ) {
    iVar3 = local_ec;
    this_00 = ParentGame(in_RSI);
    iVar2 = HanabiGame::NumColors(this_00);
    if (iVar2 <= iVar3) break;
    cVar1 = ColorIndexToChar(local_ec);
    std::__cxx11::string::operator+=(in_RDI,cVar1);
    std::vector<int,_std::allocator<int>_>::operator[](&in_RSI->fireworks_,(long)local_ec);
    std::__cxx11::to_string((int)((ulong)psVar6 >> 0x20));
    std::operator+(in_stack_fffffffffffffda8,
                   (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    std::__cxx11::string::operator+=(in_RDI,local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_130);
    local_ec = local_ec + 1;
  }
  std::__cxx11::string::operator+=(in_RDI,"\nHands:\n");
  for (local_134 = 0; uVar4 = (ulong)local_134,
      sVar5 = std::
              vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ::size(&in_RSI->hands_), uVar4 < sVar5; local_134 = local_134 + 1) {
    if (0 < local_134) {
      std::__cxx11::string::operator+=(in_RDI,"-----\n");
    }
    iVar3 = local_134;
    iVar2 = CurPlayer(in_RSI);
    if (iVar3 == iVar2) {
      std::__cxx11::string::operator+=(in_RDI,"Cur player\n");
    }
    std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
    operator[](&in_RSI->hands_,(long)local_134);
    HanabiHand::ToString_abi_cxx11_(in_stack_fffffffffffffe78);
    std::__cxx11::string::operator+=(in_RDI,local_158);
    std::__cxx11::string::~string(local_158);
  }
  this_01 = Deck(in_RSI);
  iVar3 = HanabiDeck::Size(this_01);
  std::__cxx11::to_string((int)((ulong)psVar6 >> 0x20));
  std::operator+((char *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar3,in_stack_fffffffffffffda0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (char *)CONCAT44(iVar3,in_stack_fffffffffffffda0));
  std::__cxx11::string::operator+=(in_RDI,local_178);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::operator+=(in_RDI,"Discards:");
  for (local_1bc = 0; uVar4 = (ulong)local_1bc,
      sVar5 = std::
              vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
              ::size(&in_RSI->discard_pile_), uVar4 < sVar5; local_1bc = local_1bc + 1) {
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    operator[](&in_RSI->discard_pile_,(long)local_1bc);
    HanabiCard::ToString_abi_cxx11_(in_stack_fffffffffffffe18);
    std::operator+((char *)this_01,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar3,in_stack_fffffffffffffda0));
    std::__cxx11::string::operator+=(in_RDI,local_1e0);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_200);
  }
  return psVar6;
}

Assistant:

std::string HanabiState::ToString() const {
  std::string result;
  result += "Life tokens: " + std::to_string(LifeTokens()) + "\n";
  result += "Info tokens: " + std::to_string(InformationTokens()) + "\n";
  result += "Fireworks: ";
  for (int i = 0; i < ParentGame()->NumColors(); ++i) {
    result += ColorIndexToChar(i);
    result += std::to_string(fireworks_[i]) + " ";
  }
  result += "\nHands:\n";
  for (int i = 0; i < hands_.size(); ++i) {
    if (i > 0) {
      result += "-----\n";
    }
    if (i == CurPlayer()) {
      result += "Cur player\n";
    }
    result += hands_[i].ToString();
  }
  result += "Deck size: " + std::to_string(Deck().Size()) + "\n";
  result += "Discards:";
  for (int i = 0; i < discard_pile_.size(); ++i) {
    result += " " + discard_pile_[i].ToString();
  }
  return result;
}